

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_int rf_libc_get_file_size(void *user_data,char *filename)

{
  FILE *__stream;
  long lVar1;
  
  __stream = fopen(filename,"rb");
  fseek(__stream,0,2);
  lVar1 = ftell(__stream);
  fseek(__stream,0,0);
  fclose(__stream);
  return (long)(int)lVar1;
}

Assistant:

RF_API rf_int rf_libc_get_file_size(void* user_data, const char* filename)
{
    ((void)user_data);

    FILE* file = fopen(filename, "rb");

    fseek(file, 0L, SEEK_END);
    int size = ftell(file);
    fseek(file, 0L, SEEK_SET);

    fclose(file);

    return size;
}